

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdRaycastMesh.cpp
# Opt level: O3

void __thiscall HACD::RaycastMesh::ComputeBB(RaycastMesh *this)

{
  double dVar1;
  size_t sVar2;
  Vec3<double> *pVVar3;
  long lVar4;
  double *pdVar5;
  BBox *pBVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  sVar2 = this->m_nVertices;
  if (sVar2 != 0) {
    pVVar3 = this->m_vertices;
    dVar7 = pVVar3->m_data[0];
    (this->m_bBox).m_min.m_data[0] = dVar7;
    dVar9 = pVVar3->m_data[1];
    (this->m_bBox).m_min.m_data[1] = dVar9;
    dVar11 = pVVar3->m_data[2];
    (this->m_bBox).m_min.m_data[2] = dVar11;
    dVar12 = pVVar3->m_data[0];
    (this->m_bBox).m_max.m_data[0] = dVar12;
    dVar13 = pVVar3->m_data[1];
    (this->m_bBox).m_max.m_data[1] = dVar13;
    dVar14 = pVVar3->m_data[2];
    (this->m_bBox).m_max.m_data[2] = dVar14;
    if (sVar2 != 1) {
      lVar4 = sVar2 - 1;
      pdVar5 = pVVar3[1].m_data + 2;
      do {
        dVar15 = ((Vec3<double> *)(pdVar5 + -2))->m_data[0];
        dVar10 = pdVar5[-1];
        dVar1 = *pdVar5;
        pBVar6 = &this->m_bBox;
        dVar8 = dVar15;
        dVar16 = dVar12;
        if ((dVar15 < dVar7) ||
           (pBVar6 = (BBox *)&(this->m_bBox).m_max, dVar8 = dVar7, dVar16 = dVar15, dVar12 < dVar15)
           ) {
          (pBVar6->m_min).m_data[0] = dVar15;
          dVar12 = dVar16;
          dVar7 = dVar8;
        }
        dVar15 = dVar13;
        dVar8 = dVar10;
        pVVar3 = &(this->m_bBox).m_min;
        if ((dVar10 < dVar9) ||
           (dVar15 = dVar10, dVar8 = dVar9, pVVar3 = &(this->m_bBox).m_max, dVar13 < dVar10)) {
          pVVar3->m_data[1] = dVar10;
          dVar13 = dVar15;
          dVar9 = dVar8;
        }
        dVar15 = dVar14;
        dVar10 = dVar1;
        pVVar3 = &(this->m_bBox).m_min;
        if ((dVar1 < dVar11) ||
           (dVar15 = dVar1, dVar10 = dVar11, pVVar3 = &(this->m_bBox).m_max, dVar14 < dVar1)) {
          pVVar3->m_data[2] = dVar1;
          dVar14 = dVar15;
          dVar11 = dVar10;
        }
        pdVar5 = pdVar5 + 3;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  }
  return;
}

Assistant:

void RaycastMesh::ComputeBB()
	{
		if (m_nVertices == 0)
		{
			return;
		}
		m_bBox.m_min = m_vertices[0];
		m_bBox.m_max = m_vertices[0];
		Float x, y, z;
        for (size_t v = 1; v < m_nVertices ; v++) 
        {
            x = m_vertices[v].X();
            y = m_vertices[v].Y();
            z = m_vertices[v].Z();
            if ( x < m_bBox.m_min.X()) m_bBox.m_min.X() = x;
			else if ( x > m_bBox.m_max.X()) m_bBox.m_max.X() = x;
            if ( y < m_bBox.m_min.Y()) m_bBox.m_min.Y() = y;
			else if ( y > m_bBox.m_max.Y()) m_bBox.m_max.Y() = y;
            if ( z < m_bBox.m_min.Z()) m_bBox.m_min.Z() = z;
			else if ( z > m_bBox.m_max.Z()) m_bBox.m_max.Z() = z;
        }
	}